

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_186ca1c::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  pointer *ppDVar1;
  pointer *ppPVar2;
  cmStateSnapshot *this_00;
  uint uVar3;
  _Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> _Var4;
  pointer pDVar5;
  pointer pDVar6;
  pointer __first;
  cmMakefile *pcVar7;
  pointer puVar8;
  cmInstallGenerator *pcVar9;
  long *plVar10;
  pointer pcVar11;
  cmFileAPI *this_01;
  undefined8 *puVar12;
  pointer pPVar13;
  cmState *pcVar14;
  size_type sVar15;
  undefined8 uVar16;
  pointer pPVar17;
  pointer pPVar18;
  bool bVar19;
  int iVar20;
  TargetType TVar21;
  ArrayIndex AVar22;
  Value *pVVar23;
  pointer __result;
  pointer pDVar24;
  pointer pDVar25;
  mapped_type_conflict2 *pmVar26;
  iterator iVar27;
  undefined1 *puVar28;
  ValueHolder VVar29;
  ulong uVar30;
  cmGlobalGenerator *pcVar31;
  string *psVar32;
  cmLocalGenerator *this_02;
  mapped_type *pmVar33;
  cmValue value;
  Value *this_03;
  _Tp_alloc_type *p_Var34;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *p_Var35;
  long lVar36;
  pointer pPVar37;
  undefined8 uVar38;
  ValueHolder *pVVar39;
  undefined1 *puVar40;
  _Alloc_hider this_04;
  undefined1 *puVar41;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  ValueHolder *pVVar42;
  pointer puVar43;
  ValueHolder this_05;
  long *plVar44;
  long lVar45;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar46;
  undefined8 *puVar47;
  bool bVar48;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmStateSnapshot ps;
  string buildDir;
  string prefix_1;
  Value minimumCMakeVersion;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  string sourceDir;
  string buildDirRel;
  string prefix;
  Target t;
  ValueHolder local_538;
  ValueHolder VStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [2];
  pointer local_500;
  ValueHolder local_4f8;
  string *local_4f0;
  string local_4e8;
  string local_4c8;
  ValueHolder local_4a8;
  ValueHolder VStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498 [2];
  cmFileAPI *local_478;
  pointer local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  pointer local_440;
  ValueHolder local_438;
  ValueHolder VStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [2];
  Value *local_408;
  ValueHolder local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Value local_3d8;
  ValueHolder local_3b0;
  long local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  char *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  string local_378;
  pointer local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  ValueHolder *local_340;
  pointer local_338;
  long local_330;
  ValueHolder local_328;
  ValueHolder VStack_320;
  undefined1 local_318 [8];
  undefined1 local_310 [24];
  undefined1 *local_2f8;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [344];
  _Rb_tree_node_base local_178;
  undefined8 local_158;
  _Base_ptr *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_130;
  undefined8 local_128;
  _Base_ptr p_Stack_120;
  Value local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_408 = __return_storage_ptr__;
  Json::Value::Value((Value *)&local_328,this->Config);
  pVVar23 = Json::Value::operator[](__return_storage_ptr__,"name");
  pVVar39 = &local_328;
  Json::Value::operator=(pVVar23,(Value *)&local_328);
  Json::Value::~Value((Value *)&local_328);
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  p_Var35 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)(*(long *)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl
                         + 0xa0) -
                *(long *)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl
                         + 0x98) >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < p_Var35) {
    local_388 = "vector::reserve";
LAB_0040c375:
    std::__throw_length_error(local_388);
  }
  pDVar24 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var34 = (_Tp_alloc_type *)0xcccccccccccccccd;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar24 >> 4) *
         -0x3333333333333333) < p_Var35) {
    pDVar5 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::_M_allocate(p_Var35,(size_t)pVVar39);
    pVVar39 = (ValueHolder *)
              (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_S_relocate((this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start,(pointer)pVVar39,__result,p_Var34);
    pDVar6 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar6 != (pointer)0x0) {
      pVVar39 = (ValueHolder *)
                ((long)(this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar6);
      operator_delete(pDVar6,(ulong)pVVar39);
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar5 - (long)pDVar24) + (long)__result);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var35;
  }
  local_500 = *(pointer *)
               ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98);
  local_470 = *(pointer *)
               ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0);
  if (local_500 != local_470) {
    local_4f0 = (string *)&this->DirectoryMap;
    local_440 = (pointer)&this->ProjectMap;
    local_478 = (cmFileAPI *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    local_330 = 0x7fffffffffffffd0;
    local_388 = "vector::_M_realloc_insert";
    do {
      __first = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar25 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar36 = (long)pDVar25 - (long)__first;
      local_4f8.int_ = (lVar36 >> 4) * -0x3333333333333333;
      if (pDVar25 ==
          (this->Directories).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar36 == local_330) goto LAB_0040c375;
        VVar29.int_ = local_4f8.int_;
        if (pDVar25 == __first) {
          VVar29.int_ = (LargestInt)&DAT_00000001;
        }
        p_Var35 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   *)(VVar29.string_ + (long)local_4f8.string_);
        p_Var34 = (_Tp_alloc_type *)0x199999999999999;
        if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)0x199999999999998 < p_Var35) {
          p_Var35 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        if (CARRY8(VVar29.uint_,local_4f8.uint_)) {
          p_Var35 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        pDVar24 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate(p_Var35,(size_t)pVVar39);
        this_00 = (cmStateSnapshot *)((long)pDVar24 + lVar36);
        puVar47 = (undefined8 *)((long)&pDVar24->TargetIndexes + lVar36 + 0x20);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar24->TargetIndexes + lVar36 + 0x10);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar24->TargetIndexes + lVar36);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar24->Snapshot + lVar36 + 0x10);
        *puVar47 = 0;
        puVar47[1] = 0;
        *(undefined8 *)((long)pDVar24 + lVar36) = 0;
        ((undefined8 *)((long)pDVar24 + lVar36))[1] = 0;
        cmStateSnapshot::cmStateSnapshot(this_00,(cmState *)0x0);
        this_00[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&this_00[1].Position,arrayValue);
        *(undefined1 *)((long)&this_00[3].State + 4) = 0;
        pDVar25 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_S_relocate(__first,pDVar25,pDVar24,p_Var34);
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar24;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar25 + 1;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar24 + (long)p_Var35;
      }
      else {
        (pDVar25->TargetIndexes).limit_ = 0;
        pDVar25->ProjectIndex = 0;
        pDVar25->HasInstallRule = false;
        *(undefined3 *)&pDVar25->field_0x4d = 0;
        (pDVar25->TargetIndexes).comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0;
        (pDVar25->TargetIndexes).start_ = 0;
        (pDVar25->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar25->TargetIndexes).bits_ = 0;
        (pDVar25->Snapshot).Position.Position = 0;
        pDVar25->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar25->Snapshot).State = (cmState *)0x0;
        (pDVar25->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar25->Snapshot,(cmState *)0x0);
        pDVar25->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar25->TargetIndexes,arrayValue);
        pDVar25->HasInstallRule = false;
        ppDVar1 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      pVVar42 = (ValueHolder *)
                ((this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start + (local_4f8.uint_ & 0xffffffff));
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&local_538,(cmLocalGenerator *)(local_500->Snapshot).State);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_328,(cmStateSnapshot *)&local_538);
      pVVar42[2] = (ValueHolder)local_318;
      *pVVar42 = local_328;
      pVVar42[1] = VStack_320;
      pVVar42[3].map_ = (ObjectValues *)(local_500->Snapshot).State;
      pmVar26 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_4f0,(key_type *)pVVar42);
      *pmVar26 = (mapped_type_conflict2)local_4f8.int_;
      local_498[0]._0_8_ = pVVar42[2];
      local_4a8 = *pVVar42;
      VStack_4a0 = pVVar42[1];
      pVVar39 = &local_4a8;
      local_438 = local_4a8;
      VStack_430 = VStack_4a0;
      local_428[0]._0_8_ = local_498[0]._0_8_;
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_538,(cmStateSnapshot *)pVVar39);
      bVar19 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_538);
      if (bVar19) {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_378,(cmStateSnapshot *)&local_538);
        pVVar39 = &local_4a8;
        cmStateSnapshot::GetProjectName_abi_cxx11_((string *)local_50,(cmStateSnapshot *)pVVar39);
        if (local_378._M_string_length != local_50._8_8_) goto LAB_0040a97e;
        if (local_378._M_string_length == 0) {
          bVar48 = true;
        }
        else {
          pVVar39 = (ValueHolder *)local_50._0_8_;
          iVar20 = bcmp(local_378._M_dataplus._M_p,(void *)local_50._0_8_,local_378._M_string_length
                       );
          bVar48 = iVar20 == 0;
        }
      }
      else {
LAB_0040a97e:
        bVar48 = false;
      }
      if (bVar19) {
        if ((ValueHolder *)local_50._0_8_ != (ValueHolder *)(local_50 + 0x10)) {
          pVVar39 = (ValueHolder *)(local_40._M_allocated_capacity + 1);
          operator_delete((void *)local_50._0_8_,(ulong)pVVar39);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          pVVar39 = (ValueHolder *)(local_378.field_2._M_allocated_capacity + 1);
          operator_delete(local_378._M_dataplus._M_p,(ulong)pVVar39);
        }
      }
      if (bVar48) {
        local_318 = (undefined1  [8])local_528[0]._0_8_;
        local_328 = local_538;
        VStack_320 = VStack_530;
        iVar27 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_4f0,(key_type *)&local_328);
        if ((cmFileAPI *)iVar27._M_node == local_478) goto LAB_0040c347;
        AVar22 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar27._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
        pPVar37 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar13 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar36 = (long)pPVar13 - (long)pPVar37 >> 3;
        puVar40 = (undefined1 *)(lVar36 * -0x79435e50d79435e5);
        if (pPVar13 ==
            (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)pPVar13 - (long)pPVar37 == 0x7fffffffffffffc8) goto LAB_0040c375;
          puVar28 = puVar40;
          if (pPVar13 == pPVar37) {
            puVar28 = &DAT_00000001;
          }
          puVar41 = puVar28 + (long)puVar40;
          if ((undefined1 *)0xd79435e50d7942 < puVar41) {
            puVar41 = (undefined1 *)0xd79435e50d7943;
          }
          if (CARRY8((ulong)puVar28,(ulong)puVar40)) {
            puVar41 = (undefined1 *)0xd79435e50d7943;
          }
          local_338 = pPVar13;
          if (puVar41 == (undefined1 *)0x0) {
            VVar29.int_ = 0;
          }
          else {
            VVar29.string_ = (char *)operator_new((long)puVar41 * 0x98);
          }
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)(VVar29.string_ + lVar36 * 8),(Project *)pVVar39);
          pPVar17 = local_338;
          pPVar18 = pPVar37;
          local_400 = VVar29;
          pPVar13 = local_358;
          for (; local_358 = pPVar18, pPVar17 != pPVar37; pPVar37 = pPVar37 + 1) {
            pcVar14 = (pPVar37->Snapshot).State;
            pcVar7 = (cmMakefile *)(pPVar37->Snapshot).Position.Tree;
            uVar38 = *(undefined8 *)((long)&(pPVar37->Snapshot).Position.Position + 4);
            *(undefined8 *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(VVar29.map_)->_M_t)->_M_local_buf + 0xc) =
                 *(undefined8 *)((long)&(pPVar37->Snapshot).Position.Tree + 4);
            *(undefined8 *)((long)&(VVar29.map_)->_M_t + 0x14) = uVar38;
            *(cmState **)VVar29.string_ = pcVar14;
            *(cmMakefile **)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(VVar29.map_)->_M_t)->_M_local_buf + 8) = pcVar7;
            local_350 = puVar41;
            local_348 = puVar40;
            local_340 = pVVar42;
            Json::Value::Value((Value *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                          *)&(VVar29.map_)->_M_t + 2),&pPVar37->ChildIndexes);
            Json::Value::Value((Value *)(VVar29.int_ + 0x48),&pPVar37->DirectoryIndexes);
            Json::Value::Value((Value *)(VVar29.int_ + 0x70),&pPVar37->TargetIndexes);
            Json::Value::~Value(&pPVar37->TargetIndexes);
            Json::Value::~Value(&pPVar37->DirectoryIndexes);
            Json::Value::~Value(&pPVar37->ChildIndexes);
            VVar29.string_ = (char *)(VVar29.int_ + 0x98);
            pVVar42 = local_340;
            pPVar18 = local_358;
            puVar40 = local_348;
            puVar41 = local_350;
            pPVar13 = local_358;
          }
          if (local_358 != (pointer)0x0) {
            uVar30 = (long)(this->Projects).
                           super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_358;
            pPVar37 = local_358;
            local_358 = pPVar13;
            operator_delete(pPVar37,uVar30);
            pPVar13 = local_358;
          }
          local_358 = pPVar13;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_400;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(VVar29.int_ + 0x98);
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(local_400.string_ + (long)puVar41 * 0x98);
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)pPVar13,(Project *)pVVar39);
          ppPVar2 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + 1;
        }
        AVar22 = (ArrayIndex)puVar40;
        uVar30 = (ulong)puVar40 & 0xffffffff;
        pPVar37 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pPVar37[uVar30].Snapshot.Position.Position = local_498[0]._0_8_;
        *(ValueHolder *)(pPVar37 + uVar30) = local_4a8;
        ((ValueHolder *)(pPVar37 + uVar30))[1] = VStack_4a0;
        pmVar26 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                                *)local_440,(key_type *)&local_4a8);
        *pmVar26 = AVar22;
        bVar19 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_538);
        if (bVar19) {
          local_318 = (undefined1  [8])local_528[0]._0_8_;
          local_328 = local_538;
          VStack_320 = VStack_530;
          iVar27 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                           *)local_4f0,(key_type *)&local_328);
          if ((cmFileAPI *)iVar27._M_node == local_478) goto LAB_0040c347;
          uVar3 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar27._M_node[1]._M_right].
                  ProjectIndex;
          pPVar37[uVar30].ParentIndex = uVar3;
          pPVar37 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_328,AVar22);
          Json::Value::append(&pPVar37[uVar3].ChildIndexes,(Value *)&local_328);
          Json::Value::~Value((Value *)&local_328);
        }
      }
      *(ArrayIndex *)(pVVar42 + 9) = AVar22;
      pPVar37 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_328,(UInt)local_4f8.uint_);
      pVVar39 = &local_328;
      Json::Value::append(&pPVar37[AVar22].DirectoryIndexes,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      local_500 = (pointer)&(local_500->Snapshot).Position;
    } while (local_500 != local_470);
  }
  pDVar24 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar24 !=
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar7 = (pDVar24[-1].LocalGenerator)->Makefile;
      puVar8 = (pcVar7->InstallGenerators).
               super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar43 = (pcVar7->InstallGenerators).
                     super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar8;
          puVar43 = puVar43 + 1) {
        pcVar9 = (puVar43->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        if ((pcVar9 == (cmInstallGenerator *)0x0) ||
           (lVar36 = __dynamic_cast(pcVar9,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar36 == 0)) {
          pDVar24[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar5 = pDVar24 + -1;
      if (pDVar24[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_538,
                   &pDVar5->Snapshot);
        VVar29 = VStack_530;
        for (this_05 = local_538; this_05.int_ != VVar29.int_;
            this_05.string_ = (char *)((long)&(this_05.map_)->_M_t + 0x18)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_4a8,(cmStateSnapshot *)this_05.map_);
          local_318 = (undefined1  [8])local_498[0]._0_8_;
          local_328 = local_4a8;
          VStack_320 = VStack_4a0;
          iVar27 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_328);
          if ((_Rb_tree_header *)iVar27._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_0040c347;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar27._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar24[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_538 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_538.string_,local_528[0]._M_allocated_capacity - (long)local_538);
        }
      }
      pDVar24 = pDVar5;
    } while (pDVar5 != (this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value(&local_3d8,arrayValue);
  local_468._M_allocated_capacity = 0;
  local_468._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_458._M_allocated_capacity = 0;
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  plVar44 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0x98);
  plVar10 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0xa0);
  if (plVar44 != plVar10) {
    do {
      pVVar42 = *(ValueHolder **)(*plVar44 + 0x150);
      for (pVVar39 = *(ValueHolder **)(*plVar44 + 0x148); pVVar39 != pVVar42; pVVar39 = pVVar39 + 1)
      {
        local_328 = *pVVar39;
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        emplace_back<cmGeneratorTarget*>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                   local_468._M_local_buf,(cmGeneratorTarget **)&local_328.map_);
      }
      plVar44 = plVar44 + 1;
    } while (plVar44 != plVar10);
  }
  uVar16 = local_468._8_8_;
  uVar38 = local_468._M_allocated_capacity;
  if (local_468._M_allocated_capacity != local_468._8_8_) {
    lVar45 = local_468._8_8_ - local_468._0_8_;
    uVar30 = lVar45 >> 3;
    lVar36 = 0x3f;
    if (uVar30 != 0) {
      for (; uVar30 >> lVar36 == 0; lVar36 = lVar36 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
              (local_468._M_allocated_capacity,local_468._8_8_,((uint)lVar36 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar45 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (uVar38,uVar16);
    }
    else {
      paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar38 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (uVar38,paVar46);
      for (; paVar46 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar16;
          paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar46->_M_allocated_capacity + 1)) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (paVar46);
      }
    }
  }
  local_4f8.string_ = (char *)local_468._8_8_;
  if (local_468._M_allocated_capacity != local_468._8_8_) {
    local_4f0 = &this->TopBuild;
    local_470 = (pointer)&this->DirectoryMap;
    local_478 = (cmFileAPI *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    local_440 = (pointer)&this->TargetIndexMap;
    uVar38 = local_468._M_allocated_capacity;
    do {
      VVar29 = (ValueHolder)*(ValueHolder *)uVar38;
      TVar21 = cmGeneratorTarget::GetType((cmGeneratorTarget *)VVar29.map_);
      if ((TVar21 != GLOBAL_TARGET) &&
         (bVar19 = cmGeneratorTarget::IsInBuildSystem((cmGeneratorTarget *)VVar29.map_), bVar19)) {
        AVar22 = Json::Value::size(&local_3d8);
        local_500 = (pointer)CONCAT44(local_500._4_4_,AVar22);
        VStack_320 = (ValueHolder)this->Config;
        local_3f8._M_allocated_capacity = (size_type)VVar29;
        local_328 = VVar29;
        pcVar31 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar29.map_);
        psVar32 = cmake::GetHomeDirectory_abi_cxx11_(pcVar31->CMakeInstance);
        local_318 = (undefined1  [8])(local_310 + 8);
        pcVar11 = (psVar32->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_318,pcVar11,pcVar11 + psVar32->_M_string_length);
        pcVar31 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar29.map_);
        psVar32 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar31->CMakeInstance);
        local_2f8 = local_2f0 + 8;
        pcVar11 = (psVar32->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar11,pcVar11 + psVar32->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)(local_2f0 + 0x18),
                   &(*(cmMakefile **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(local_328.map_)->_M_t)->_M_local_buf + 8))->SourceGroups);
        local_538.string_ = (char *)local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_538,local_318,(char *)(local_310._0_8_ + (long)local_318));
        BacktraceData::BacktraceData((BacktraceData *)(local_2d0 + 0x10),(string *)&local_538);
        if (local_538 != local_528) {
          operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
        }
        local_178._M_color = _S_red;
        local_178._M_parent = (_Base_ptr)0x0;
        local_178._M_left = &local_178;
        local_158 = 0;
        local_150 = &p_Stack_120;
        local_148 = &DAT_00000001;
        local_140 = 0;
        uStack_138 = 0;
        local_130 = 0x3f800000;
        local_128 = 0;
        p_Stack_120 = (_Base_ptr)0x0;
        local_178._M_right = local_178._M_left;
        Json::Value::Value(&local_118,arrayValue);
        local_f0 = &aStack_c0;
        local_e8 = &DAT_00000001;
        local_e0 = 0;
        uStack_d8 = 0;
        local_d0 = 0x3f800000;
        local_a8 = 0;
        aStack_c0._8_8_ = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        aStack_c0._M_allocated_capacity = 0;
        local_a0 = &uStack_70;
        local_98 = &DAT_00000001;
        local_90 = 0;
        uStack_88 = 0;
        local_80 = 0x3f800000;
        local_58 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        psVar32 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3b0,"target-",psVar32);
        if (local_3a8 != 0) {
          lVar36 = 0;
          do {
            if ((local_3b0.string_[lVar36] == '\\') || (local_3b0.string_[lVar36] == '/')) {
              local_3b0.string_[lVar36] = '_';
            }
            lVar36 = lVar36 + 1;
          } while (local_3a8 != lVar36);
        }
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_538,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_3b0.int_,local_538.uint_);
          if (local_538 != local_528) {
            operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
          }
        }
        this_01 = this->FileAPI;
        Target::Dump((Value *)&local_538,(Target *)&local_328);
        cmFileAPI::MaybeJsonFile
                  ((Value *)&local_438,this_01,(Value *)&local_538,(string *)&local_3b0);
        Json::Value::~Value((Value *)&local_538);
        psVar32 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        Json::Value::Value((Value *)&local_4a8,psVar32);
        pVVar23 = Json::Value::operator[]((Value *)&local_438,"name");
        Json::Value::operator=(pVVar23,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        TargetId(&local_4e8,(cmGeneratorTarget *)local_3f8._M_allocated_capacity,local_4f0);
        Json::Value::Value((Value *)&local_4a8,&local_4e8);
        pVVar23 = Json::Value::operator[]((Value *)&local_438,"id");
        Json::Value::operator=(pVVar23,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
        this_02 = cmGeneratorTarget::GetLocalGenerator
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_4c8,this_02);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_4e8,(cmStateSnapshot *)&local_4c8);
        local_498[0]._0_8_ = local_4e8.field_2._M_allocated_capacity;
        local_4a8.string_ = local_4e8._M_dataplus._M_p;
        VStack_4a0 = (ValueHolder)local_4e8._M_string_length;
        iVar27 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_470,(key_type *)&local_4a8);
        if ((cmFileAPI *)iVar27._M_node == local_478) goto LAB_0040c347;
        uVar3 = *(uint *)&iVar27._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_4a8,uVar3);
        pVVar23 = Json::Value::operator[]((Value *)&local_438,"directoryIndex");
        Json::Value::operator=(pVVar23,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pDVar24 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_4a8,(UInt)local_500);
        Json::Value::append(&pDVar24[uVar3].TargetIndexes,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        uVar3 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].ProjectIndex;
        Json::Value::Value((Value *)&local_4a8,uVar3);
        pVVar23 = Json::Value::operator[]((Value *)&local_438,"projectIndex");
        Json::Value::operator=(pVVar23,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pPVar37 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_4a8,(UInt)local_500);
        Json::Value::append(&pPVar37[uVar3].TargetIndexes,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pmVar33 = std::__detail::
                  _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_440,(key_type *)&local_3f8._M_allocated_capacity);
        *pmVar33 = (UInt)local_500;
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0.string_,local_3a0._M_allocated_capacity + 1);
        }
        Target::~Target((Target *)&local_328);
        Json::Value::append(&local_3d8,(Value *)&local_438);
        Json::Value::~Value((Value *)&local_438);
      }
      uVar38 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&((ObjectValues *)uVar38)->_M_t)->_M_local_buf + 8;
    } while (uVar38 != local_4f8.int_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_468._M_allocated_capacity,
                    local_458._M_allocated_capacity - local_468._0_8_);
  }
  pVVar23 = Json::Value::operator[](local_408,"targets");
  Json::Value::operator=(pVVar23,&local_3d8);
  Json::Value::~Value(&local_3d8);
  Json::Value::Value((Value *)&local_3b0,arrayValue);
  pDVar24 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_440 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar24 != local_440) {
    local_4f0 = &this->TopSource;
    local_470 = (pointer)&this->TopBuild;
    local_400.string_ = (char *)&this->TargetIndexMap;
    local_4f8.string_ = (char *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      local_4c8.field_2._M_allocated_capacity = 0x726f746365726964;
      local_4c8.field_2._M_local_buf[8] = 'y';
      local_4c8._M_string_length = 9;
      local_4c8.field_2._M_local_buf[9] = '\0';
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar24->Snapshot);
      psVar32 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_328);
      cmSystemTools::RelativeIfUnder((string *)&local_468,local_4f0,psVar32);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar24->Snapshot);
      psVar32 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_328);
      cmSystemTools::RelativeIfUnder((string *)&local_3f8,(string *)local_470,psVar32);
      bVar19 = cmsys::SystemTools::FileIsFullPath((string *)&local_3f8);
      if (bVar19) {
        bVar19 = cmsys::SystemTools::FileIsFullPath((string *)&local_468);
        if (!bVar19) {
          local_538.int_ = (LargestInt)&DAT_00000001;
          VStack_530.string_ = (char *)local_528;
          local_528[0]._0_1_ = 0x2d;
          local_328.int_ = local_4c8._M_string_length;
          VStack_320.string_ = local_4c8._M_dataplus._M_p;
          local_318 = (undefined1  [8])&DAT_00000001;
          local_310._8_8_ = local_468._8_8_;
          local_310._16_8_ = local_468._M_allocated_capacity;
          views._M_len = 3;
          views._M_array = (iterator)&local_328;
          local_310._0_8_ = VStack_530.string_;
          cmCatViews_abi_cxx11_((string *)&local_4a8,views);
          goto LAB_0040b80e;
        }
      }
      else {
        local_538.int_ = (LargestInt)&DAT_00000001;
        VStack_530.string_ = (char *)local_528;
        local_528[0]._0_1_ = 0x2d;
        local_328.int_ = local_4c8._M_string_length;
        VStack_320.string_ = local_4c8._M_dataplus._M_p;
        local_318 = (undefined1  [8])&DAT_00000001;
        local_310._8_8_ = local_3f8._8_8_;
        local_310._16_8_ = local_3f8._M_allocated_capacity;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_328;
        local_310._0_8_ = VStack_530.string_;
        cmCatViews_abi_cxx11_((string *)&local_4a8,views_00);
LAB_0040b80e:
        std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_4a8.bool_);
        if (local_4a8 != local_498) {
          operator_delete(local_4a8.string_,(ulong)(local_498[0]._0_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        lVar36 = 0;
        do {
          if ((local_4c8._M_dataplus._M_p[lVar36] == '\\') ||
             (local_4c8._M_dataplus._M_p[lVar36] == '/')) {
            local_4c8._M_dataplus._M_p[lVar36] = '.';
          }
          lVar36 = lVar36 + 1;
        } while (local_4c8._M_string_length != lVar36);
      }
      if (this->Config->_M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_328,"-",this->Config);
        std::__cxx11::string::_M_append((char *)&local_4c8,local_328.uint_);
        if (local_328 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318) {
          operator_delete(local_328.string_,(ulong)((long)local_318 + 1));
        }
      }
      VVar29 = (ValueHolder)pDVar24->LocalGenerator;
      VStack_320 = (ValueHolder)this->Config;
      local_318 = (undefined1  [8])local_400;
      local_500 = pDVar24;
      local_328 = VVar29;
      psVar32 = cmake::GetHomeDirectory_abi_cxx11_
                          (*(cmake **)
                            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(VVar29.int_ + 0x88))->_M_allocated_capacity + 0x78));
      local_310._0_8_ = local_310 + 0x10;
      pcVar11 = (psVar32->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_318 + 8),pcVar11,pcVar11 + psVar32->_M_string_length);
      psVar32 = cmake::GetHomeOutputDirectory_abi_cxx11_
                          (*(cmake **)
                            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(VVar29.int_ + 0x88))->_M_allocated_capacity + 0x78));
      local_2f0._0_8_ = local_2f0 + 0x10;
      pcVar11 = (psVar32->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,pcVar11,pcVar11 + psVar32->_M_string_length);
      local_538.string_ = (char *)local_528;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,local_310._0_8_,(char *)(local_310._8_8_ + local_310._0_8_));
      BacktraceData::BacktraceData((BacktraceData *)local_2d0,(string *)&local_538);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      local_478 = this->FileAPI;
      Json::Value::Value((Value *)&local_438,objectValue);
      Json::Value::Value((Value *)&local_4a8,objectValue);
      psVar32 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_328.map_);
      cmSystemTools::RelativeIfUnder(&local_4e8,(string *)(local_318 + 8),psVar32);
      Json::Value::Value((Value *)&local_538,&local_4e8);
      pVVar23 = Json::Value::operator[]((Value *)&local_4a8,"source");
      Json::Value::operator=(pVVar23,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      psVar32 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_328.map_);
      cmSystemTools::RelativeIfUnder(&local_4e8,(string *)local_2f0,psVar32);
      Json::Value::Value((Value *)&local_538,&local_4e8);
      pVVar23 = Json::Value::operator[]((Value *)&local_4a8,"build");
      Json::Value::operator=(pVVar23,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      pVVar23 = Json::Value::operator[]((Value *)&local_438,"paths");
      Json::Value::operator=(pVVar23,(Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_4a8);
      Json::Value::Value((Value *)&local_4a8,arrayValue);
      puVar12 = *(undefined8 **)
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_328.int_ + 0x70))->_M_allocated_capacity + 0x220);
      for (puVar47 = *(undefined8 **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_328.int_ + 0x70))->_M_allocated_capacity + 0x218);
          puVar47 != puVar12; puVar47 = puVar47 + 1) {
        DirectoryObject::DumpInstaller
                  ((Value *)&local_538,(DirectoryObject *)&local_328,(cmInstallGenerator *)*puVar47)
        ;
        bVar19 = Json::Value::empty((Value *)&local_538);
        if (!bVar19) {
          Json::Value::append((Value *)&local_4a8,(Value *)&local_538);
        }
        Json::Value::~Value((Value *)&local_538);
      }
      pVVar23 = Json::Value::operator[]((Value *)&local_438,"installers");
      Json::Value::operator=(pVVar23,(Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_4a8);
      BacktraceData::Dump((Value *)&local_538,(BacktraceData *)local_2d0);
      pDVar24 = local_500;
      pVVar23 = Json::Value::operator[]((Value *)&local_438,"backtraceGraph");
      Json::Value::operator=(pVVar23,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      cmFileAPI::MaybeJsonFile(&local_3d8,local_478,(Value *)&local_438,&local_4c8);
      Json::Value::~Value((Value *)&local_438);
      DirectoryObject::~DirectoryObject((DirectoryObject *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_allocated_capacity != &local_3e8) {
        operator_delete((void *)local_3f8._M_allocated_capacity,
                        (ulong)(local_3e8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_allocated_capacity != &local_458) {
        operator_delete((void *)local_468._M_allocated_capacity,
                        (ulong)(local_458._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar24->Snapshot);
      psVar32 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_328);
      local_438.string_ = (char *)local_428;
      pcVar11 = (psVar32->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,pcVar11,pcVar11 + psVar32->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_538,local_4f0,(string *)&local_438);
      Json::Value::Value((Value *)&local_328,(String *)&local_538);
      pVVar23 = Json::Value::operator[](&local_3d8,"source");
      Json::Value::operator=(pVVar23,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar24->Snapshot);
      psVar32 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_328);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      pcVar11 = (psVar32->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,pcVar11,pcVar11 + psVar32->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_538,(string *)local_470,&local_4e8);
      Json::Value::Value((Value *)&local_328,(String *)&local_538);
      pVVar23 = Json::Value::operator[](&local_3d8,"build");
      Json::Value::operator=(pVVar23,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_468,&pDVar24->Snapshot);
      bVar19 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
      if (bVar19) {
        local_528[0]._M_allocated_capacity = local_458._M_allocated_capacity;
        local_538 = (ValueHolder)local_468._M_allocated_capacity;
        VStack_530 = (ValueHolder)local_468._8_8_;
        iVar27 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_538);
        if (iVar27._M_node == local_4f8) {
LAB_0040c347:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x26d,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_328,*(UInt *)&iVar27._M_node[1]._M_right);
        pVVar23 = Json::Value::operator[](&local_3d8,"parentIndex");
        Json::Value::operator=(pVVar23,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      Json::Value::Value((Value *)&local_538,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_4c8,
                 &pDVar24->Snapshot);
      sVar15 = local_4c8._M_string_length;
      for (this_04._M_p = local_4c8._M_dataplus._M_p; this_04._M_p != (pointer)sVar15;
          this_04._M_p = this_04._M_p + 0x18) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_3f8,(cmStateSnapshot *)this_04._M_p);
        local_498[0]._0_8_ = local_3e8._M_allocated_capacity;
        local_4a8 = (ValueHolder)local_3f8._M_allocated_capacity;
        VStack_4a0 = (ValueHolder)local_3f8._8_8_;
        iVar27 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_4a8);
        if (iVar27._M_node == local_4f8) goto LAB_0040c347;
        Json::Value::Value((Value *)&local_328,*(UInt *)&iVar27._M_node[1]._M_right);
        Json::Value::append((Value *)&local_538,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        local_4c8.field_2._M_allocated_capacity - (long)local_4c8._M_dataplus._M_p);
      }
      bVar19 = Json::Value::empty((Value *)&local_538);
      pDVar24 = local_500;
      if (!bVar19) {
        pVVar23 = Json::Value::operator[](&local_3d8,"childIndexes");
        Json::Value::operator=(pVVar23,(Value *)&local_538);
      }
      Json::Value::Value((Value *)&local_328,pDVar24->ProjectIndex);
      pVVar23 = Json::Value::operator[](&local_3d8,"projectIndex");
      Json::Value::operator=(pVVar23,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      bVar19 = Json::Value::empty(&pDVar24->TargetIndexes);
      if (!bVar19) {
        pVVar23 = Json::Value::operator[](&local_3d8,"targetIndexes");
        Json::Value::operator=(pVVar23,&pDVar24->TargetIndexes);
      }
      local_4c8.field_2._M_allocated_capacity = (pDVar24->Snapshot).Position.Position;
      local_4c8._M_dataplus._M_p = (pointer)(pDVar24->Snapshot).State;
      local_4c8._M_string_length = (size_type)(pDVar24->Snapshot).Position.Tree;
      Json::Value::Value((Value *)&local_4a8,nullValue);
      local_328.string_ = local_318;
      local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&DAT_0000001e;
      local_328.int_ = std::__cxx11::string::_M_create(&local_328.uint_,(ulong)&local_380);
      local_318 = (undefined1  [8])local_380;
      (((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
      (((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
      *(char *)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent = 'Q';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 1) = 'U';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 2) = 'I';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 3) = 'R';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 4) = 'E';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 5) = 'D';
      builtin_strncpy((char *)((long)&(local_328.map_)->_M_t + 0x16),"_VERSION",8);
      builtin_strncpy((char *)local_328,"CMAKE_MI",8);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_328.map_)->_M_t)->_M_local_buf + 8) = 0x45525f4d554d494e;
      VStack_320.int_ = (LargestInt)local_380;
      local_328.string_[(long)local_380] = '\0';
      value = cmStateSnapshot::GetDefinition(&local_4c8,(string *)&local_328);
      if (local_328 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318) {
        operator_delete(local_328.string_,(ulong)((long)local_318 + 1));
      }
      if (value.Value != (string *)0x0) {
        Json::Value::Value((Value *)&local_328,objectValue);
        Json::Value::operator=((Value *)&local_4a8,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
        Json::Value::Value((Value *)&local_328,value.Value);
        pVVar23 = Json::Value::operator[]((Value *)&local_4a8,"string");
        Json::Value::operator=(pVVar23,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      bVar19 = Json::Value::isNull((Value *)&local_4a8);
      if (!bVar19) {
        pVVar23 = Json::Value::operator[](&local_3d8,"minimumCMakeVersion");
        Json::Value::operator=(pVVar23,(Value *)&local_4a8);
      }
      if (pDVar24->HasInstallRule == true) {
        Json::Value::Value((Value *)&local_328,true);
        pVVar23 = Json::Value::operator[](&local_3d8,"hasInstallRule");
        Json::Value::operator=(pVVar23,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      Json::Value::~Value((Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      if (local_438 != local_428) {
        operator_delete(local_438.string_,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      Json::Value::append((Value *)&local_3b0,&local_3d8);
      Json::Value::~Value(&local_3d8);
      pDVar24 = pDVar24 + 1;
    } while (pDVar24 != local_440);
  }
  pVVar23 = Json::Value::operator[](local_408,"directories");
  Json::Value::operator=(pVVar23,(Value *)&local_3b0);
  Json::Value::~Value((Value *)&local_3b0);
  Json::Value::Value((Value *)&local_4a8,arrayValue);
  pPVar37 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar13 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar37 != pPVar13) {
    do {
      Json::Value::Value((Value *)&local_538,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_438,&pPVar37->Snapshot);
      Json::Value::Value((Value *)&local_328,(String *)&local_438);
      pVVar23 = Json::Value::operator[]((Value *)&local_538,"name");
      Json::Value::operator=(pVVar23,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_438 != local_428) {
        operator_delete(local_438.string_,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      if (pPVar37->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_328,pPVar37->ParentIndex);
        pVVar23 = Json::Value::operator[]((Value *)&local_538,"parentIndex");
        Json::Value::operator=(pVVar23,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      bVar19 = Json::Value::empty(&pPVar37->ChildIndexes);
      if (!bVar19) {
        pVVar23 = Json::Value::operator[]((Value *)&local_538,"childIndexes");
        Json::Value::operator=(pVVar23,&pPVar37->ChildIndexes);
      }
      pVVar23 = Json::Value::operator[]((Value *)&local_538,"directoryIndexes");
      Json::Value::operator=(pVVar23,&pPVar37->DirectoryIndexes);
      bVar19 = Json::Value::empty(&pPVar37->TargetIndexes);
      if (!bVar19) {
        pVVar23 = Json::Value::operator[]((Value *)&local_538,"targetIndexes");
        Json::Value::operator=(pVVar23,&pPVar37->TargetIndexes);
      }
      Json::Value::append((Value *)&local_4a8,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      pPVar37 = pPVar37 + 1;
    } while (pPVar37 != pPVar13);
  }
  pVVar23 = local_408;
  this_03 = Json::Value::operator[](local_408,"projects");
  Json::Value::operator=(this_03,(Value *)&local_4a8);
  Json::Value::~Value((Value *)&local_4a8);
  return pVVar23;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}